

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int index;
  char cchar;
  size_type lbrack;
  size_t findex;
  value_type keychar;
  size_type sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                       (in_stack_ffffffffffffffb0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  this = local_20;
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RSI);
  if ((long)&(this->_M_dataplus)._M_p + sVar3 + 1 < sVar2) {
    in_stack_ffffffffffffffa0 = local_20;
    in_stack_ffffffffffffffa8 = in_RDI;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_RSI);
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
    local_21 = *pvVar4;
    while( true ) {
      in_stack_ffffffffffffff9f = true;
      if ((local_21 != '^') && (in_stack_ffffffffffffff9f = true, local_21 != '*')) {
        in_stack_ffffffffffffff9f = local_21 == '/';
      }
      if ((bool)in_stack_ffffffffffffff9f == false) goto LAB_006e31ed;
      if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      break;
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 rfind(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
      if (local_20 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff)
      goto LAB_006e31ed;
      in_stack_ffffffffffffff88 = local_20;
      in_stack_ffffffffffffff90 = in_RDI;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_RSI);
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      local_21 = *pvVar4;
    }
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff;
  }
LAB_006e31ed:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI)
  ;
  while( true ) {
    if (local_20 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          (char *)in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
    if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0xffffffffffffffff) {
      return (size_t)local_20;
    }
    if (pbVar5 < local_20) {
      return (size_t)local_20;
    }
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
    getMatchCharacter(*pvVar4);
    iVar1 = (int)pbVar5 + -2;
    segmentcheckReverse((string *)in_stack_ffffffffffffffa8,
                        (char)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
                        (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    if (iVar1 < 0) break;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)iVar1 < local_20)
    {
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 rfind(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}